

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int BrotliEncoderSetParameter(BrotliEncoderState *state,BrotliEncoderParameter p,uint32_t value)

{
  uint32_t value_local;
  BrotliEncoderParameter p_local;
  BrotliEncoderState *state_local;
  
  if (state->is_initialized_ == 0) {
    switch(p) {
    case BROTLI_PARAM_MODE:
      (state->params).mode = value;
      state_local._4_4_ = 1;
      break;
    case BROTLI_PARAM_QUALITY:
      (state->params).quality = value;
      state_local._4_4_ = 1;
      break;
    case BROTLI_PARAM_LGWIN:
      (state->params).lgwin = value;
      state_local._4_4_ = 1;
      break;
    case BROTLI_PARAM_LGBLOCK:
      (state->params).lgblock = value;
      state_local._4_4_ = 1;
      break;
    case BROTLI_PARAM_DISABLE_LITERAL_CONTEXT_MODELING:
      if ((value == 0) || (value == 1)) {
        (state->params).disable_literal_context_modeling = (uint)(value != 0);
        state_local._4_4_ = 1;
      }
      else {
        state_local._4_4_ = 0;
      }
      break;
    case BROTLI_PARAM_SIZE_HINT:
      (state->params).size_hint = (ulong)value;
      state_local._4_4_ = 1;
      break;
    default:
      state_local._4_4_ = 0;
    }
  }
  else {
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

BROTLI_BOOL BrotliEncoderSetParameter(
    BrotliEncoderState* state, BrotliEncoderParameter p, uint32_t value) {
  /* Changing parameters on the fly is not implemented yet. */
  if (state->is_initialized_) return BROTLI_FALSE;
  /* TODO: Validate/clamp parameters here. */
  switch (p) {
    case BROTLI_PARAM_MODE:
      state->params.mode = (BrotliEncoderMode)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_QUALITY:
      state->params.quality = (int)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_LGWIN:
      state->params.lgwin = (int)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_LGBLOCK:
      state->params.lgblock = (int)value;
      return BROTLI_TRUE;

    case BROTLI_PARAM_DISABLE_LITERAL_CONTEXT_MODELING:
      if ((value != 0) && (value != 1)) return BROTLI_FALSE;
      state->params.disable_literal_context_modeling = TO_BROTLI_BOOL(!!value);
      return BROTLI_TRUE;

    case BROTLI_PARAM_SIZE_HINT:
      state->params.size_hint = value;
      return BROTLI_TRUE;

    default: return BROTLI_FALSE;
  }
}